

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

Color * __thiscall
scene::World::shade(Color *__return_storage_ptr__,World *this,Computation *comp,int recursion_depth)

{
  Light *light;
  bool bVar1;
  size_type sVar2;
  const_reference ppLVar3;
  Tuple4d *pTVar4;
  Primitive *pPVar5;
  element_type *peVar6;
  Color local_140;
  Color local_128;
  Color local_110;
  Color local_f8;
  Color local_e0;
  Color local_c8;
  Color local_b0;
  double local_88;
  double reflectance;
  shared_ptr<material::Material> mat;
  Color refracted;
  Color reflected;
  int local_20;
  bool shadowed;
  int i;
  int recursion_depth_local;
  Computation *comp_local;
  World *this_local;
  
  image::Color::Color(__return_storage_ptr__,0.0,0.0,0.0);
  local_20 = 0;
  while( true ) {
    sVar2 = std::vector<scene::light::Light_*,_std::allocator<scene::light::Light_*>_>::size
                      (&this->m_lights);
    if (sVar2 <= (ulong)(long)local_20) break;
    ppLVar3 = std::vector<scene::light::Light_*,_std::allocator<scene::light::Light_*>_>::at
                        (&this->m_lights,(long)local_20);
    light = *ppLVar3;
    pTVar4 = core::Computation::over_point(comp);
    bVar1 = shadow(this,light,pTVar4);
    if (!bVar1) {
      ppLVar3 = std::vector<scene::light::Light_*,_std::allocator<scene::light::Light_*>_>::at
                          (&this->m_lights,(long)local_20);
      (*(*ppLVar3)->_vptr_Light[1])(&reflected.b,*ppLVar3,comp);
      image::operator+=(__return_storage_ptr__,(Color *)&reflected.b);
    }
    local_20 = local_20 + 1;
  }
  if (4 < recursion_depth) goto LAB_0011dab6;
  reflection((Color *)&refracted.b,this,comp,recursion_depth);
  refraction((Color *)&mat.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,this,comp,recursion_depth);
  pPVar5 = core::Computation::object(comp);
  std::shared_ptr<material::Material>::shared_ptr
            ((shared_ptr<material::Material> *)&reflectance,&pPVar5->material);
  peVar6 = std::__shared_ptr_access<material::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<material::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&reflectance);
  if (peVar6->reflective <= 0.0) {
LAB_0011da80:
    image::operator+(&local_f8,(Color *)&refracted.b,
                     (Color *)&mat.
                               super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
    image::operator+=(__return_storage_ptr__,&local_f8);
  }
  else {
    peVar6 = std::__shared_ptr_access<material::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<material::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&reflectance);
    if (peVar6->transparency <= 0.0) goto LAB_0011da80;
    local_88 = schlick(this,comp);
    image::operator*(&local_c8,(Color *)&refracted.b,local_88);
    image::operator*(&local_e0,
                     (Color *)&mat.
                               super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount,1.0 - local_88);
    image::operator+(&local_b0,&local_c8,&local_e0);
    image::operator+=(__return_storage_ptr__,&local_b0);
  }
  std::shared_ptr<material::Material>::~shared_ptr((shared_ptr<material::Material> *)&reflectance);
LAB_0011dab6:
  pPVar5 = core::Computation::object(comp);
  pTVar4 = core::Computation::point(comp);
  geometry::primitive::Primitive::color(&local_140,pPVar5,pTVar4);
  image::hadamard_product(&local_128,&this->m_ambient,&local_140);
  pPVar5 = core::Computation::object(comp);
  peVar6 = std::__shared_ptr_access<material::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<material::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&pPVar5->material);
  image::operator*(&local_110,&local_128,peVar6->ambient);
  image::operator+=(__return_storage_ptr__,&local_110);
  return __return_storage_ptr__;
}

Assistant:

image::Color scene::World::shade(const core::Computation &comp, int recursion_depth) const
{
    image::Color ret{0, 0, 0};

    // surface
    for (int i = 0; i < m_lights.size(); i++)
    {
	bool shadowed = shadow(m_lights.at(i), comp.over_point());
	if (!shadowed)
	    ret += m_lights.at(i)->lighting(comp);
    }

    // reflection and refraction
    if (recursion_depth < 5)
    {
	image::Color reflected = reflection(comp, recursion_depth);
	image::Color refracted = refraction(comp, recursion_depth);

	std::shared_ptr<material::Material> mat = comp.object()->material;
	if (mat->reflective > 0 && mat->transparency > 0)
	{
	    double reflectance = schlick(comp);
	    ret += reflected * reflectance + refracted * (1 - reflectance);
	}
	else
	    ret += reflected + refracted;
    }

    // ambient
    ret += image::hadamard_product(m_ambient, comp.object()->color(comp.point())) * comp.object()->material->ambient;

    return ret;
}